

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall
asmjit::CodeHolder::copyFlattenedData
          (CodeHolder *this,void *dst,size_t dstSize,uint32_t copyOptions)

{
  void *pvVar1;
  long lVar2;
  ulong __n;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n_00;
  ulong uVar8;
  
  uVar4 = (ulong)(this->_sectionsByOrder).super_ZoneVectorBase._size;
  if (uVar4 == 0) {
    uVar8 = 0;
  }
  else {
    pvVar1 = (this->_sectionsByOrder).super_ZoneVectorBase._data;
    lVar5 = 0;
    uVar8 = 0;
    do {
      lVar2 = *(long *)((long)pvVar1 + lVar5);
      uVar6 = *(ulong *)(lVar2 + 0x10);
      uVar7 = dstSize - uVar6;
      if ((dstSize < uVar6) || (__n = *(ulong *)(lVar2 + 0x50), uVar7 < __n)) {
        return 2;
      }
      memcpy((void *)((long)dst + uVar6),*(void **)(lVar2 + 0x48),__n);
      if (((copyOptions & 1) == 0) || (uVar3 = *(ulong *)(lVar2 + 0x18), uVar3 <= __n)) {
        __n_00 = 0;
      }
      else {
        if (uVar3 < uVar7) {
          uVar7 = uVar3;
        }
        __n_00 = uVar7 - __n;
        memset((void *)((long)((long)dst + uVar6) + __n),0,__n_00);
      }
      uVar6 = __n + uVar6 + __n_00;
      if (uVar8 <= uVar6) {
        uVar8 = uVar6;
      }
      lVar5 = lVar5 + 8;
    } while (uVar4 << 3 != lVar5);
  }
  if (((copyOptions & 2) != 0) && (uVar8 <= dstSize && dstSize - uVar8 != 0)) {
    memset((void *)((long)dst + uVar8),0,dstSize - uVar8);
  }
  return 0;
}

Assistant:

Error CodeHolder::copyFlattenedData(void* dst, size_t dstSize, uint32_t copyOptions) noexcept {
  size_t end = 0;
  for (Section* section : _sectionsByOrder) {
    if (section->offset() > dstSize)
      return DebugUtils::errored(kErrorInvalidArgument);

    size_t bufferSize = section->bufferSize();
    size_t offset = size_t(section->offset());

    if (ASMJIT_UNLIKELY(dstSize - offset < bufferSize))
      return DebugUtils::errored(kErrorInvalidArgument);

    uint8_t* dstTarget = static_cast<uint8_t*>(dst) + offset;
    size_t paddingSize = 0;
    memcpy(dstTarget, section->data(), bufferSize);

    if ((copyOptions & kCopyPadSectionBuffer) && bufferSize < section->virtualSize()) {
      paddingSize = Support::min<size_t>(dstSize - offset, size_t(section->virtualSize())) - bufferSize;
      memset(dstTarget + bufferSize, 0, paddingSize);
    }

    end = Support::max(end, offset + bufferSize + paddingSize);
  }

  if (end < dstSize && (copyOptions & kCopyPadTargetBuffer)) {
    memset(static_cast<uint8_t*>(dst) + end, 0, dstSize - end);
  }

  return kErrorOk;
}